

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::rectMesh(Mesh *__return_storage_ptr__,float _x,float _y,float _w,float _h)

{
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar1;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar3;
  undefined8 local_24;
  undefined8 uStack_1c;
  float local_14;
  
  aVar1.x = _x + _x + -1.0;
  aVar3.y = _y + _y + -1.0;
  local_14 = _h;
  Mesh::Mesh(__return_storage_ptr__);
  local_24._4_4_ = aVar3.y;
  local_24._0_4_ = aVar1.x;
  uStack_1c = (ulong)(uint)uStack_1c._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_1c._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_1c._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_1c._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_24);
  aVar2.x = _w + _w + aVar1.x;
  local_24._4_4_ = aVar3.y;
  local_24._0_4_ = aVar2.x;
  uStack_1c = (ulong)(uint)uStack_1c._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_1c._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_1c._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_1c._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_24);
  aVar3.y = aVar3.y + local_14 + local_14;
  local_24._4_4_ = aVar3.y;
  local_24._0_4_ = aVar2.x;
  uStack_1c = (ulong)(uint)uStack_1c._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_1c._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_1c._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_1c._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_24);
  local_24._4_4_ = aVar3.y;
  local_24._0_4_ = aVar1.x;
  uStack_1c = (ulong)(uint)uStack_1c._4_4_ << 0x20;
  Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  uStack_1c._0_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  uStack_1c._4_4_ = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  Mesh::addColor(__return_storage_ptr__,(vec4 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  uStack_1c._0_4_ = 1.0;
  Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_24);
  local_24._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  local_24._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x3f800000;
  Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_24);
  Mesh::addIndex(__return_storage_ptr__,0);
  Mesh::addIndex(__return_storage_ptr__,1);
  Mesh::addIndex(__return_storage_ptr__,2);
  Mesh::addIndex(__return_storage_ptr__,2);
  Mesh::addIndex(__return_storage_ptr__,3);
  Mesh::addIndex(__return_storage_ptr__,0);
  return __return_storage_ptr__;
}

Assistant:

Mesh rectMesh(float _x, float _y, float _w, float _h) {
    float x = _x * 2.0f - 1.0f;
    float y = _y * 2.0f - 1.0f;
    float w = _w * 2.0f;
    float h = _h * 2.0f;

    Mesh mesh;
    mesh.addVertex(glm::vec3(x, y, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(0.0, 0.0));

    mesh.addVertex(glm::vec3(x+w, y, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(1.0, 0.0));

    mesh.addVertex(glm::vec3(x+w, y+h, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(1.0, 1.0));

    mesh.addVertex(glm::vec3(x, y+h, 0.0));
    mesh.addColor(glm::vec4(1.0));
    mesh.addNormal(glm::vec3(0.0, 0.0, 1.0));
    mesh.addTexCoord(glm::vec2(0.0, 1.0));

    mesh.addIndex(0);   mesh.addIndex(1);   mesh.addIndex(2);
    mesh.addIndex(2);   mesh.addIndex(3);   mesh.addIndex(0);

    return mesh;
}